

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXAnimation.cpp
# Opt level: O3

AnimationCurveMap * __thiscall
Assimp::FBX::AnimationCurveNode::Curves_abi_cxx11_(AnimationCurveNode *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Connection *this_00;
  Object *pOVar2;
  mapped_type pAVar3;
  mapped_type *ppAVar4;
  pointer ppCVar5;
  string local_68;
  vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_> local_48
  ;
  
  if ((this->curves)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
    Document::GetConnectionsByDestinationSequenced
              (&local_48,this->doc,(this->super_Object).id,"AnimationCurve");
    if (local_48.
        super__Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_48.
        super__Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      paVar1 = &local_68.field_2;
      ppCVar5 = local_48.
                super__Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      do {
        this_00 = *ppCVar5;
        if ((this_00->prop)._M_string_length != 0) {
          pOVar2 = Connection::SourceObject(this_00);
          if (pOVar2 == (Object *)0x0) {
            local_68._M_dataplus._M_p = (pointer)paVar1;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_68,
                       "failed to read source object for AnimationCurve->AnimationCurveNode link, ignoring"
                       ,"");
            Util::DOMWarning(&local_68,(this->super_Object).element);
          }
          else {
            pAVar3 = (mapped_type)
                     __dynamic_cast(pOVar2,&Object::typeinfo,&AnimationCurve::typeinfo,0);
            if (pAVar3 != (mapped_type)0x0) {
              ppAVar4 = std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::FBX::AnimationCurve_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::FBX::AnimationCurve_*>_>_>
                        ::operator[](&this->curves,&this_00->prop);
              *ppAVar4 = pAVar3;
              goto LAB_00190720;
            }
            local_68._M_dataplus._M_p = (pointer)paVar1;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_68,
                       "source object for ->AnimationCurveNode link is not an AnimationCurve","");
            Util::DOMWarning(&local_68,(this->super_Object).element);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_68._M_dataplus._M_p != paVar1) {
            operator_delete(local_68._M_dataplus._M_p);
          }
        }
LAB_00190720:
        ppCVar5 = ppCVar5 + 1;
      } while (ppCVar5 !=
               local_48.
               super__Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    }
    if (local_48.
        super__Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_48.
                      super__Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  return &this->curves;
}

Assistant:

const AnimationCurveMap& AnimationCurveNode::Curves() const
{
    if ( curves.empty() ) {
        // resolve attached animation curves
        const std::vector<const Connection*>& conns = doc.GetConnectionsByDestinationSequenced(ID(),"AnimationCurve");

        for(const Connection* con : conns) {

            // link should go for a property
            if (!con->PropertyName().length()) {
                continue;
            }

            const Object* const ob = con->SourceObject();
            if(!ob) {
                DOMWarning("failed to read source object for AnimationCurve->AnimationCurveNode link, ignoring",&element);
                continue;
            }

            const AnimationCurve* const anim = dynamic_cast<const AnimationCurve*>(ob);
            if(!anim) {
                DOMWarning("source object for ->AnimationCurveNode link is not an AnimationCurve",&element);
                continue;
            }

            curves[con->PropertyName()] = anim;
        }
    }

    return curves;
}